

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O1

void nni_resolv(nni_resolv_item *item,nni_aio *aio)

{
  char *__s;
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  nng_err result;
  
  nni_aio_reset(aio);
  __s = item->ri_host;
  if (__s != (char *)0x0) {
    sVar3 = strlen(__s);
    if (sVar3 < 0x100) {
      iVar2 = strcmp(__s,"*");
      if (iVar2 != 0) goto LAB_00121670;
    }
    result = NNG_EADDRINVAL;
LAB_001216c4:
    nni_aio_finish_error(aio,result);
    return;
  }
LAB_00121670:
  nni_mtx_lock(&resolv_mtx);
  nni_aio_set_prov_data(aio,item);
  _Var1 = nni_aio_start(aio,resolv_cancel,item);
  if (_Var1) {
    if (resolv_fini == '\x01') {
      nni_mtx_unlock(&resolv_mtx);
      result = NNG_ECLOSED;
      goto LAB_001216c4;
    }
    nni_list_append(&resolv_aios,aio);
    nni_cv_wake1(&resolv_cv);
  }
  nni_mtx_unlock(&resolv_mtx);
  return;
}

Assistant:

void
nni_resolv(nni_resolv_item *item, nni_aio *aio)
{
	nni_aio_reset(aio);
	if (item->ri_host != NULL) {
		if ((strlen(item->ri_host) >= 256) ||
		    (strcmp(item->ri_host, "*") == 0)) {
			nni_aio_finish_error(aio, NNG_EADDRINVAL);
			return;
		}
	}

	nni_mtx_lock(&resolv_mtx);
	nni_aio_set_prov_data(aio, item);
	if (!nni_aio_start(aio, resolv_cancel, item)) {
		nni_mtx_unlock(&resolv_mtx);
		return;
	}

	if (resolv_fini) {
		nni_mtx_unlock(&resolv_mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	nni_list_append(&resolv_aios, aio);
	nni_cv_wake1(&resolv_cv);
	nni_mtx_unlock(&resolv_mtx);
}